

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall
cmComputeLinkInformation::FeatureDescriptor::FeatureDescriptor
          (FeatureDescriptor *this,string *name,string *itemPathFormat,string *itemNameFormat)

{
  std::__cxx11::string::string((string *)this,(string *)name);
  this->Supported = true;
  (this->Prefix)._M_dataplus._M_p = (pointer)&(this->Prefix).field_2;
  (this->Prefix)._M_string_length = 0;
  (this->Prefix).field_2._M_local_buf[0] = '\0';
  (this->Suffix)._M_dataplus._M_p = (pointer)&(this->Suffix).field_2;
  (this->Suffix)._M_string_length = 0;
  (this->Suffix).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&this->ItemPathFormat,(string *)itemPathFormat);
  std::__cxx11::string::string((string *)&this->ItemNameFormat,(string *)itemNameFormat);
  return;
}

Assistant:

cmComputeLinkInformation::FeatureDescriptor::FeatureDescriptor(
  std::string name, std::string itemPathFormat, std::string itemNameFormat)
  : Name(std::move(name))
  , Supported(true)
  , ItemPathFormat(std::move(itemPathFormat))
  , ItemNameFormat(std::move(itemNameFormat))
{
}